

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::StringPutcMethod::~StringPutcMethod(StringPutcMethod *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit StringPutcMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Putc, SubroutineKind::Function, 2,
                               {&builtins.intType, &builtins.byteType}, builtins.voidType, true,
                               /* isFirstArgLValue */ true) {}